

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH3
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ushort uVar5;
  uint8_t uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  uint32_t uVar16;
  ulong uVar17;
  int iVar18;
  uint *puVar19;
  uint16_t uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  uint32_t uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  size_t sVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  bool bVar35;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  Command *local_c8;
  ulong local_a0;
  uint local_68;
  
  uVar30 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar3 = (position - 7) + num_bytes;
  sVar31 = position;
  if (7 < num_bytes) {
    sVar31 = uVar3;
  }
  lVar14 = 0x200;
  if (params->quality < 9) {
    lVar14 = 0x40;
  }
  uVar1 = position + num_bytes;
  lVar2 = position + num_bytes;
  uVar33 = *last_insert_len;
  uVar12 = lVar14 + position;
  local_c8 = commands;
  do {
LAB_001022eb:
    uVar29 = position;
    if (uVar1 <= uVar29 + 8) {
      *last_insert_len = (uVar33 + uVar1) - uVar29;
      *num_commands = *num_commands + ((long)local_c8 - (long)commands >> 4);
      return;
    }
    local_a0 = uVar1 - uVar29;
    uVar11 = uVar30;
    if (uVar29 < uVar30) {
      uVar11 = uVar29;
    }
    uVar9 = uVar29 & ringbuffer_mask;
    local_e0 = (ulong)*dist_cache;
    local_f0 = 0x7e4;
    local_68 = (uint)ringbuffer_mask;
    uVar6 = (uint8_t)*(long *)(ringbuffer + uVar9);
    if (uVar29 - local_e0 < uVar29) {
      uVar15 = (ulong)((uint)(uVar29 - local_e0) & local_68);
      if (ringbuffer[uVar15] == uVar6) {
        uVar17 = local_a0 & 0xfffffffffffffff8;
        uVar22 = 0;
        lVar10 = 0;
LAB_00102364:
        if (local_a0 >> 3 == uVar22) {
          uVar32 = (ulong)((uint)local_a0 & 7);
          for (; (bVar35 = uVar32 != 0, uVar32 = uVar32 - 1, uVar22 = local_a0, bVar35 &&
                 (uVar22 = uVar17, ringbuffer[uVar17 + uVar15] == ringbuffer[uVar17 + uVar9]));
              uVar17 = uVar17 + 1) {
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar22 * 8 + uVar9) ==
              *(ulong *)(ringbuffer + uVar22 * 8 + uVar15)) break;
          uVar17 = *(ulong *)(ringbuffer + uVar22 * 8 + uVar15) ^
                   *(ulong *)(ringbuffer + uVar22 * 8 + uVar9);
          uVar15 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          uVar22 = (uVar15 >> 3 & 0x1fffffff) - lVar10;
        }
        if ((3 < uVar22) && (uVar15 = uVar22 * 0x87 + 0x78f, 0x7e4 < uVar15)) {
          uVar6 = ringbuffer[uVar22 + uVar9];
          local_f0 = uVar15;
          goto LAB_001023fa;
        }
      }
      local_e0 = 0;
      uVar22 = 0;
    }
    else {
      local_e0 = 0;
      uVar22 = 0;
    }
LAB_001023fa:
    uVar15 = *(long *)(ringbuffer + uVar9) * -0x42e1ca5843000000;
    puVar19 = (uint *)(hasher + (uVar15 >> 0x30) * 4 + 0x28);
    for (iVar26 = 0; iVar26 != 2; iVar26 = iVar26 + 1) {
      uVar8 = *puVar19;
      uVar7 = local_68 & uVar8;
      if (((uVar6 == ringbuffer[uVar22 + uVar7]) && (uVar29 != uVar8)) &&
         (uVar17 = uVar29 - uVar8, uVar17 <= uVar11)) {
        uVar32 = 0;
        lVar10 = 0;
LAB_00102464:
        uVar23 = (ulong)((uint)local_a0 & 7);
        uVar24 = local_a0 & 0xfffffffffffffff8;
        if (local_a0 >> 3 == uVar32) {
          for (; (uVar32 = local_a0, uVar23 != 0 &&
                 (uVar32 = uVar24, ringbuffer[uVar24 + uVar7] == ringbuffer[uVar24 + uVar9]));
              uVar24 = uVar24 + 1) {
            uVar23 = uVar23 - 1;
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar32 * 8 + uVar9) ==
              *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar7)) goto code_r0x00102477;
          uVar23 = *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar7) ^
                   *(ulong *)(ringbuffer + uVar32 * 8 + uVar9);
          uVar32 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
            }
          }
          uVar32 = (uVar32 >> 3 & 0x1fffffff) - lVar10;
        }
        if (3 < uVar32) {
          iVar18 = 0x1f;
          if ((uint)uVar17 != 0) {
            for (; (uint)uVar17 >> iVar18 == 0; iVar18 = iVar18 + -1) {
            }
          }
          uVar23 = (ulong)(iVar18 * -0x1e + 0x780) + uVar32 * 0x87;
          if (local_f0 < uVar23) {
            uVar6 = ringbuffer[uVar32 + uVar9];
            uVar22 = uVar32;
            local_f0 = uVar23;
            local_e0 = uVar17;
          }
        }
      }
      puVar19 = puVar19 + 1;
    }
    *(uint *)(hasher + (ulong)(((uint)(ushort)(uVar15 >> 0x30) +
                               (uint)(((uint)uVar29 >> 3 & 1) != 0)) * 4) + 0x28) = (uint)uVar29;
    if (local_f0 < 0x7e5) {
      uVar33 = uVar33 + 1;
      position = uVar29 + 1;
      if (uVar12 < position) {
        if ((uint)((int)lVar14 * 4) + uVar12 < position) {
          uVar11 = uVar29 + 0x11;
          if (uVar3 <= uVar29 + 0x11) {
            uVar11 = uVar3;
          }
          for (; position < uVar11; position = position + 4) {
            *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                        (position & ringbuffer_mask)
                                                                        ) * -0x42e1ca5843000000) >>
                                                      0x30) + (uint)(((uint)position >> 3 & 1) != 0)
                                       ) * 4) + 0x28) = (uint)position;
            uVar33 = uVar33 + 4;
          }
        }
        else {
          uVar11 = uVar29 + 9;
          if (uVar3 <= uVar29 + 9) {
            uVar11 = uVar3;
          }
          for (; position < uVar11; position = position + 2) {
            *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                        (position & ringbuffer_mask)
                                                                        ) * -0x42e1ca5843000000) >>
                                                      0x30) + (uint)(((uint)position >> 3 & 1) != 0)
                                       ) * 4) + 0x28) = (uint)position;
            uVar33 = uVar33 + 2;
          }
        }
      }
      goto LAB_001022eb;
    }
    iVar26 = *dist_cache;
    uVar11 = (lVar2 + -1) - uVar29;
    iVar18 = 0;
    uVar12 = uVar33;
    do {
      uVar15 = (ulong)((uint)uVar11 & 7);
      local_a0 = local_a0 - 1;
      uVar9 = uVar22 - 1;
      if (local_a0 <= uVar22 - 1) {
        uVar9 = local_a0;
      }
      if (4 < params->quality) {
        uVar9 = 0;
      }
      uVar17 = uVar29 + 1;
      local_d8 = uVar30;
      if (uVar17 < uVar30) {
        local_d8 = uVar17;
      }
      uVar23 = uVar17 & ringbuffer_mask;
      uVar6 = ringbuffer[uVar9 + uVar23];
      uVar32 = uVar17 - (long)iVar26;
      local_e8 = 0x7e4;
      if ((uVar32 < uVar17) && (uVar8 = (uint)uVar32 & local_68, uVar6 == ringbuffer[uVar9 + uVar8])
         ) {
        uVar32 = 0;
        lVar10 = 0;
LAB_001026d9:
        if (uVar11 >> 3 == uVar32) {
          uVar24 = uVar15;
          for (uVar32 = -lVar10;
              (bVar35 = uVar24 != 0, uVar24 = uVar24 - 1, bVar35 &&
              (ringbuffer[uVar32 + uVar8] == ringbuffer[uVar32 + uVar23])); uVar32 = uVar32 + 1) {
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar32 * 8 + uVar23) ==
              *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar8)) goto code_r0x001026f1;
          uVar24 = *(ulong *)(ringbuffer + uVar32 * 8 + (ulong)uVar8) ^
                   *(ulong *)(ringbuffer + uVar32 * 8 + uVar23);
          uVar32 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
            }
          }
          uVar32 = (uVar32 >> 3 & 0x1fffffff) - lVar10;
        }
        if ((uVar32 < 4) || (uVar24 = uVar32 * 0x87 + 0x78f, uVar24 < 0x7e5)) goto LAB_00102746;
        uVar6 = ringbuffer[uVar32 + uVar23];
        uVar9 = uVar32;
        local_f8 = (long)iVar26;
        local_e8 = uVar24;
      }
      else {
LAB_00102746:
        local_f8 = 0;
      }
      puVar19 = (uint *)(hasher + ((ulong)(*(long *)(ringbuffer + uVar23) * -0x42e1ca5843000000) >>
                                  0x30) * 4 + 0x28);
      for (iVar34 = 0; iVar34 != 2; iVar34 = iVar34 + 1) {
        uVar8 = *puVar19;
        uVar7 = local_68 & uVar8;
        if (((uVar6 == ringbuffer[uVar9 + uVar7]) && (uVar17 != uVar8)) &&
           (uVar32 = uVar17 - uVar8, uVar32 <= local_d8)) {
          uVar24 = 0;
          lVar10 = 0;
LAB_001027b9:
          if (uVar11 >> 3 == uVar24) {
            uVar25 = uVar15;
            for (uVar24 = -lVar10;
                (bVar35 = uVar25 != 0, uVar25 = uVar25 - 1, bVar35 &&
                (ringbuffer[uVar24 + uVar7] == ringbuffer[uVar24 + uVar23])); uVar24 = uVar24 + 1) {
            }
          }
          else {
            if (*(ulong *)(ringbuffer + uVar24 * 8 + uVar23) ==
                *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)uVar7)) goto code_r0x001027cd;
            uVar25 = *(ulong *)(ringbuffer + uVar24 * 8 + (ulong)uVar7) ^
                     *(ulong *)(ringbuffer + uVar24 * 8 + uVar23);
            uVar24 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
              }
            }
            uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar10;
          }
          if (3 < uVar24) {
            iVar4 = 0x1f;
            if ((uint)uVar32 != 0) {
              for (; (uint)uVar32 >> iVar4 == 0; iVar4 = iVar4 + -1) {
              }
            }
            uVar25 = (ulong)(iVar4 * -0x1e + 0x780) + uVar24 * 0x87;
            if (local_e8 < uVar25) {
              uVar6 = ringbuffer[uVar24 + uVar23];
              uVar9 = uVar24;
              local_f8 = uVar32;
              local_e8 = uVar25;
            }
          }
        }
        puVar19 = puVar19 + 1;
      }
      *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer + uVar23) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                 (uint)(((uint)uVar17 >> 3 & 1) != 0)) * 4) + 0x28) = (uint)uVar17;
      if (local_e8 < local_f0 + 0xaf) {
        uVar9 = uVar22;
        uVar17 = uVar29;
        uVar15 = uVar12;
        local_d8 = uVar30;
        if (uVar29 < uVar30) {
          local_d8 = uVar29;
        }
        break;
      }
      uVar15 = uVar33 + 4;
      local_e0 = local_f8;
      if (iVar18 == 3) break;
      uVar15 = uVar12 + 1;
      iVar18 = iVar18 + 1;
      uVar32 = uVar29 + 9;
      uVar11 = uVar11 - 1;
      local_f0 = local_e8;
      uVar22 = uVar9;
      uVar12 = uVar15;
      uVar29 = uVar17;
    } while (uVar32 < uVar1);
    if (local_d8 < local_e0) {
LAB_00102942:
      uVar12 = local_e0 + 0xf;
LAB_00102946:
      if ((local_e0 <= local_d8) && (uVar12 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = (int)local_e0;
      }
    }
    else {
      if (local_e0 != (long)*dist_cache) {
        uVar12 = 1;
        if (local_e0 != (long)dist_cache[1]) {
          uVar12 = (local_e0 + 3) - (long)*dist_cache;
          if (uVar12 < 7) {
            bVar13 = (byte)((int)uVar12 << 2);
            uVar8 = 0x9750468;
          }
          else {
            uVar12 = (local_e0 + 3) - (long)dist_cache[1];
            if (6 < uVar12) {
              uVar12 = 2;
              if ((local_e0 != (long)dist_cache[2]) && (uVar12 = 3, local_e0 != (long)dist_cache[3])
                 ) goto LAB_00102942;
              goto LAB_00102946;
            }
            bVar13 = (byte)((int)uVar12 << 2);
            uVar8 = 0xfdb1ace;
          }
          uVar12 = (ulong)(uVar8 >> (bVar13 & 0x1f) & 0xf);
        }
        goto LAB_00102946;
      }
      uVar12 = 0;
    }
    uVar8 = (uint)uVar15;
    local_c8->insert_len_ = uVar8;
    uVar16 = (uint32_t)uVar9;
    local_c8->copy_len_ = uVar16;
    uVar29 = (ulong)(params->dist).num_direct_distance_codes;
    uVar33 = uVar29 + 0x10;
    uVar27 = 0;
    if (uVar33 <= uVar12) {
      uVar7 = (params->dist).distance_postfix_bits;
      bVar13 = (byte)uVar7;
      uVar29 = ((uVar12 - uVar29) + (4L << (bVar13 & 0x3f))) - 0x10;
      uVar21 = 0x1f;
      uVar28 = (uint)uVar29;
      if (uVar28 != 0) {
        for (; uVar28 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      uVar21 = (uVar21 ^ 0xffffffe0) + 0x1f;
      uVar11 = (ulong)((uVar29 >> ((ulong)uVar21 & 0x3f) & 1) != 0);
      lVar10 = (ulong)uVar21 - (ulong)uVar7;
      uVar12 = (~(-1 << (bVar13 & 0x1f)) & uVar28) + uVar33 +
               (uVar11 + lVar10 * 2 + 0xfffe << (bVar13 & 0x3f)) | lVar10 * 0x400;
      uVar27 = (uint32_t)(uVar29 - (uVar11 + 2 << ((byte)uVar21 & 0x3f)) >> (bVar13 & 0x3f));
    }
    local_c8->dist_prefix_ = (uint16_t)uVar12;
    local_c8->dist_extra_ = uVar27;
    if (5 < uVar15) {
      if (uVar15 < 0x82) {
        uVar8 = 0x1f;
        uVar7 = (uint)(uVar15 - 2);
        if (uVar7 != 0) {
          for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = (int)(uVar15 - 2 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                (uVar8 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (uVar15 < 0x842) {
        uVar7 = 0x1f;
        if (uVar8 - 0x42 != 0) {
          for (; uVar8 - 0x42 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar8 = (uVar7 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar8 = 0x15;
        if (0x1841 < uVar15) {
          uVar8 = (uint)(ushort)(0x17 - (uVar15 < 0x5842));
        }
      }
    }
    uVar33 = (ulong)(int)uVar16;
    if (uVar33 < 10) {
      uVar7 = uVar16 - 2;
    }
    else if (uVar33 < 0x86) {
      uVar7 = 0x1f;
      uVar21 = (uint)(uVar33 - 6);
      if (uVar21 != 0) {
        for (; uVar21 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (int)(uVar33 - 6 >> ((char)(uVar7 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar7 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar7 = 0x17;
      if (uVar33 < 0x846) {
        uVar7 = 0x1f;
        if (uVar16 - 0x46 != 0) {
          for (; uVar16 - 0x46 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        uVar7 = (uVar7 ^ 0xffe0) + 0x2c;
      }
    }
    uVar5 = (ushort)uVar7;
    uVar20 = (uVar5 & 7) + ((ushort)uVar8 & 7) * 8;
    if ((((uVar12 & 0x3ff) == 0) && ((ushort)uVar8 < 8)) && (uVar5 < 0x10)) {
      if (7 < uVar5) {
        uVar20 = uVar20 + 0x40;
      }
    }
    else {
      iVar26 = ((uVar8 & 0xffff) >> 3) * 3 + ((uVar7 & 0xffff) >> 3);
      uVar20 = uVar20 + ((ushort)(0x520d40 >> ((char)iVar26 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar26 * 0x40 + 0x40;
    }
    local_c8->cmd_prefix_ = uVar20;
    *num_literals = *num_literals + uVar15;
    position = uVar9 + uVar17;
    uVar33 = sVar31;
    if (position < sVar31) {
      uVar33 = position;
    }
    uVar29 = uVar17 + 2;
    if (local_e0 < uVar9 >> 2) {
      uVar12 = position + local_e0 * -4;
      if (uVar12 < uVar29) {
        uVar12 = uVar29;
      }
      uVar29 = uVar12;
      if (uVar33 < uVar12) {
        uVar29 = uVar33;
      }
    }
    uVar12 = uVar17 + lVar14 + uVar9 * 2;
    local_c8 = local_c8 + 1;
    for (; uVar29 < uVar33; uVar29 = uVar29 + 1) {
      *(uint *)(hasher + (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (uVar29 & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                 (uint)(((uint)uVar29 >> 3 & 1) != 0)) * 4) + 0x28) = (uint)uVar29;
    }
    uVar33 = 0;
  } while( true );
  lVar10 = lVar10 + -8;
  uVar22 = uVar22 + 1;
  goto LAB_00102364;
code_r0x00102477:
  lVar10 = lVar10 + -8;
  uVar32 = uVar32 + 1;
  goto LAB_00102464;
code_r0x001026f1:
  lVar10 = lVar10 + -8;
  uVar32 = uVar32 + 1;
  goto LAB_001026d9;
code_r0x001027cd:
  lVar10 = lVar10 + -8;
  uVar24 = uVar24 + 1;
  goto LAB_001027b9;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}